

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void * l_alloc(void *ud,void *ptr,size_t osize,size_t nsize)

{
  void *pvVar1;
  
  if (nsize != 0) {
    pvVar1 = realloc(ptr,nsize);
    return pvVar1;
  }
  free(ptr);
  return (void *)0x0;
}

Assistant:

static void*l_alloc(void*ud,void*ptr,size_t osize,size_t nsize){
(void)ud;
(void)osize;
if(nsize==0){
free(ptr);
return NULL;
}
else
return realloc(ptr,nsize);
}